

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::ToPropertyDescriptorForGenericObjects
               (Var propertySpec,PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  Var pvVar3;
  bool bVar4;
  BOOL BVar5;
  Var in_RAX;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  PropertyRecord *pPVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  PropertyId propertyId;
  char *pcVar12;
  Var local_38;
  Var value;
  
  local_38 = in_RAX;
  BVar5 = IsObject(propertySpec);
  if (BVar5 == 0) {
    return 0;
  }
  pRVar6 = VarTo<Js::RecyclableObject>(propertySpec);
  BVar5 = GetProperty_InternalSimple(pRVar6,pRVar6,0x194,&local_38,scriptContext);
  if (BVar5 != 0) {
    BVar5 = JavascriptConversion::ToBoolean(local_38,scriptContext);
    PropertyDescriptor::SetEnumerable(descriptor,BVar5 != 0);
  }
  BVar5 = GetProperty_InternalSimple(pRVar6,pRVar6,0x195,&local_38,scriptContext);
  if (BVar5 != 0) {
    BVar5 = JavascriptConversion::ToBoolean(local_38,scriptContext);
    PropertyDescriptor::SetConfigurable(descriptor,BVar5 != 0);
  }
  BVar5 = GetProperty_InternalSimple(pRVar6,pRVar6,0x197,&local_38,scriptContext);
  if (BVar5 != 0) {
    PropertyDescriptor::SetValue(descriptor,local_38);
  }
  BVar5 = GetProperty_InternalSimple(pRVar6,pRVar6,0x196,&local_38,scriptContext);
  if (BVar5 != 0) {
    BVar5 = JavascriptConversion::ToBoolean(local_38,scriptContext);
    PropertyDescriptor::SetWritable(descriptor,BVar5 != 0);
  }
  BVar5 = GetProperty_InternalSimple(pRVar6,pRVar6,0x198,&local_38,scriptContext);
  pvVar3 = local_38;
  if (BVar5 != 0) {
    if (local_38 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00abd36c;
      *puVar7 = 0;
LAB_00abd058:
      this = UnsafeVarTo<Js::RecyclableObject>(pvVar3);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00abd36c;
        *puVar7 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar1) {
        BVar5 = RecyclableObject::IsExternal(this);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
          ;
          pcVar10 = "(typeId < TypeIds_Limit || obj->IsExternal())";
          pcVar9 = "GetTypeId aValue has invalid TypeId";
          uVar11 = 0xe;
          goto LAB_00abd11d;
        }
        goto LAB_00abd132;
      }
      if (TVar1 != TypeIds_Undefined) goto LAB_00abd132;
    }
    else {
      if (((ulong)local_38 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)local_38 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)local_38 >> 0x32 == 0 &&
            ((ulong)local_38 & 0xffff000000000000) != 0x1000000000000) goto LAB_00abd058;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
        ;
        pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
        pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
        uVar11 = 0x2a;
LAB_00abd11d:
        bVar4 = Throw::ReportAssert(pcVar12,uVar11,pcVar10,pcVar9);
        if (!bVar4) goto LAB_00abd36c;
        *puVar7 = 0;
      }
LAB_00abd132:
      bVar4 = JavascriptConversion::IsCallable(local_38);
      if (!bVar4) {
        propertyId = 0x198;
        goto LAB_00abd380;
      }
    }
    PropertyDescriptor::SetGetter(descriptor,local_38);
  }
  BVar5 = GetProperty_InternalSimple(pRVar6,pRVar6,0x19b,&local_38,scriptContext);
  pvVar3 = local_38;
  if (BVar5 == 0) {
    return 1;
  }
  if (local_38 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00abd36c;
    *puVar7 = 0;
LAB_00abd26b:
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar3);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00abd36c;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar6->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Undefined) goto LAB_00abd34c;
    }
    else {
      BVar5 = RecyclableObject::IsExternal(pRVar6);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        pcVar10 = "(typeId < TypeIds_Limit || obj->IsExternal())";
        pcVar9 = "GetTypeId aValue has invalid TypeId";
        uVar11 = 0xe;
        goto LAB_00abd32f;
      }
    }
  }
  else if (((ulong)local_38 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)local_38 & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)local_38 >> 0x32 == 0 && ((ulong)local_38 & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00abd26b;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    pcVar12 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar11 = 0x2a;
LAB_00abd32f:
    bVar4 = Throw::ReportAssert(pcVar12,uVar11,pcVar10,pcVar9);
    if (!bVar4) {
LAB_00abd36c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  bVar4 = JavascriptConversion::IsCallable(local_38);
  if (!bVar4) {
    propertyId = 0x19b;
LAB_00abd380:
    pPVar8 = ScriptContext::GetPropertyName(scriptContext,propertyId);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)(pPVar8 + 1));
  }
LAB_00abd34c:
  PropertyDescriptor::SetSetter(descriptor,local_38);
  return 1;
}

Assistant:

BOOL JavascriptOperators::ToPropertyDescriptorForGenericObjects(Var propertySpec, PropertyDescriptor* descriptor, ScriptContext* scriptContext)
    {
        if (!JavascriptOperators::IsObject(propertySpec))
        {
            return FALSE;
        }

        Var value;
        RecyclableObject* propertySpecObj = VarTo<RecyclableObject>(propertySpec);

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::enumerable, &value, scriptContext))
        {
            descriptor->SetEnumerable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::configurable, &value, scriptContext))
        {
            descriptor->SetConfigurable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::value, &value, scriptContext))
        {
            descriptor->SetValue(value);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::writable, &value, scriptContext))
        {
            descriptor->SetWritable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::get, &value, scriptContext))
        {
            if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::get)->GetBuffer());
            }
            descriptor->SetGetter(value);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::set, &value, scriptContext))
        {
            if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::set)->GetBuffer());
            }
            descriptor->SetSetter(value);
        }

        return TRUE;
    }